

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_declare_vtab(sqlite3 *db,char *zCreateTable)

{
  Table *pTVar1;
  sqlite3 *psVar2;
  long lVar3;
  Index *pIVar4;
  int iVar5;
  char *zFormat;
  Index *pIdx;
  Table *pNew;
  char *zErr;
  Table *pTab;
  Parse *pPStack_30;
  int rc;
  Parse *pParse;
  VtabCtx *pCtx;
  char *zCreateTable_local;
  sqlite3 *db_local;
  
  pTab._4_4_ = 0;
  pNew = (Table *)0x0;
  pCtx = (VtabCtx *)zCreateTable;
  zCreateTable_local = (char *)db;
  sqlite3_mutex_enter(db->mutex);
  pParse = *(Parse **)(zCreateTable_local + 0x1d0);
  if ((pParse == (Parse *)0x0) || (pParse->rc != 0)) {
    sqlite3Error((sqlite3 *)zCreateTable_local,0x15);
    sqlite3_mutex_leave(*(sqlite3_mutex **)(zCreateTable_local + 0x18));
    db_local._4_4_ = sqlite3MisuseError(0x1ef2f);
  }
  else {
    zErr = pParse->zErrMsg;
    pPStack_30 = (Parse *)sqlite3DbMallocZero((sqlite3 *)zCreateTable_local,0x250);
    if (pPStack_30 == (Parse *)0x0) {
      pTab._4_4_ = 7;
    }
    else {
      pPStack_30->declareVtab = '\x01';
      pPStack_30->db = (sqlite3 *)zCreateTable_local;
      pPStack_30->nQueryLoop = 1;
      iVar5 = sqlite3RunParser(pPStack_30,(char *)pCtx,(char **)&pNew);
      if ((((iVar5 == 0) && (pPStack_30->pNewTable != (Table *)0x0)) &&
          (zCreateTable_local[0x55] == '\0')) &&
         ((pPStack_30->pNewTable->pSelect == (Select *)0x0 &&
          (pPStack_30->pNewTable->nModuleArg == 0)))) {
        if (*(long *)(zErr + 8) == 0) {
          pTVar1 = pPStack_30->pNewTable;
          *(Column **)(zErr + 8) = pTVar1->aCol;
          *(i16 *)(zErr + 0x46) = pTVar1->nCol;
          *(u32 *)(zErr + 0x40) = pTVar1->tabFlags & 0x60 | *(uint *)(zErr + 0x40);
          pTVar1->nCol = 0;
          pTVar1->aCol = (Column *)0x0;
          if (((pTVar1->tabFlags & 0x20) != 0) &&
             (psVar2 = pParse->db->pVdbe->db, lVar3._0_4_ = psVar2->nChange,
             lVar3._4_4_ = psVar2->nTotalChange, lVar3 != 0)) {
            pTab._4_4_ = 1;
          }
          pIVar4 = pTVar1->pIndex;
          if (pIVar4 != (Index *)0x0) {
            *(Index **)(zErr + 0x10) = pIVar4;
            pTVar1->pIndex = (Index *)0x0;
            pIVar4->pTable = (Table *)zErr;
          }
        }
        pParse->rc = 1;
      }
      else {
        zFormat = (char *)0x0;
        if (pNew != (Table *)0x0) {
          zFormat = "%s";
        }
        sqlite3ErrorWithMsg((sqlite3 *)zCreateTable_local,1,zFormat,pNew);
        sqlite3DbFree((sqlite3 *)zCreateTable_local,pNew);
        pTab._4_4_ = 1;
      }
      pPStack_30->declareVtab = '\0';
      if (pPStack_30->pVdbe != (Vdbe *)0x0) {
        sqlite3VdbeFinalize(pPStack_30->pVdbe);
      }
      sqlite3DeleteTable((sqlite3 *)zCreateTable_local,pPStack_30->pNewTable);
      sqlite3ParserReset(pPStack_30);
      sqlite3DbFree((sqlite3 *)zCreateTable_local,pPStack_30);
    }
    pTab._4_4_ = sqlite3ApiExit((sqlite3 *)zCreateTable_local,pTab._4_4_);
    sqlite3_mutex_leave(*(sqlite3_mutex **)(zCreateTable_local + 0x18));
    db_local._4_4_ = pTab._4_4_;
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_declare_vtab(sqlite3 *db, const char *zCreateTable){
  VtabCtx *pCtx;
  Parse *pParse;
  int rc = SQLITE_OK;
  Table *pTab;
  char *zErr = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zCreateTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pCtx = db->pVtabCtx;
  if( !pCtx || pCtx->bDeclared ){
    sqlite3Error(db, SQLITE_MISUSE);
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_MISUSE_BKPT;
  }
  pTab = pCtx->pTab;
  assert( IsVirtual(pTab) );

  pParse = sqlite3StackAllocZero(db, sizeof(*pParse));
  if( pParse==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }else{
    pParse->declareVtab = 1;
    pParse->db = db;
    pParse->nQueryLoop = 1;
  
    if( SQLITE_OK==sqlite3RunParser(pParse, zCreateTable, &zErr) 
     && pParse->pNewTable
     && !db->mallocFailed
     && !pParse->pNewTable->pSelect
     && !IsVirtual(pParse->pNewTable)
    ){
      if( !pTab->aCol ){
        Table *pNew = pParse->pNewTable;
        Index *pIdx;
        pTab->aCol = pNew->aCol;
        pTab->nCol = pNew->nCol;
        pTab->tabFlags |= pNew->tabFlags & (TF_WithoutRowid|TF_NoVisibleRowid);
        pNew->nCol = 0;
        pNew->aCol = 0;
        assert( pTab->pIndex==0 );
        if( !HasRowid(pNew) && pCtx->pVTable->pMod->pModule->xUpdate!=0 ){
          rc = SQLITE_ERROR;
        }
        pIdx = pNew->pIndex;
        if( pIdx ){
          assert( pIdx->pNext==0 );
          pTab->pIndex = pIdx;
          pNew->pIndex = 0;
          pIdx->pTable = pTab;
        }
      }
      pCtx->bDeclared = 1;
    }else{
      sqlite3ErrorWithMsg(db, SQLITE_ERROR, (zErr ? "%s" : 0), zErr);
      sqlite3DbFree(db, zErr);
      rc = SQLITE_ERROR;
    }
    pParse->declareVtab = 0;
  
    if( pParse->pVdbe ){
      sqlite3VdbeFinalize(pParse->pVdbe);
    }
    sqlite3DeleteTable(db, pParse->pNewTable);
    sqlite3ParserReset(pParse);
    sqlite3StackFree(db, pParse);
  }

  assert( (rc&0xff)==rc );
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}